

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall
MatroskaDemuxer::matroska_parse_blockgroup(MatroskaDemuxer *this,int64_t cluster_time)

{
  int *levelUp;
  uint32_t uVar1;
  int iVar2;
  size_type sVar3;
  _Elt_pointer ppAVar4;
  int is_keyframe;
  int in_stack_ffffffffffffff80;
  int size;
  int64_t num;
  int64_t local_60;
  int64_t local_58;
  uint8_t *data;
  int64_t local_48;
  size_type local_40;
  uint32_t local_34;
  
  local_48 = cluster_time;
  local_40 = std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>::size(&(this->packets).c);
  data = (uint8_t *)0x0;
  size = 0;
  levelUp = &this->level_up;
  local_60 = -0x8000000000000000;
  is_keyframe = 1;
  iVar2 = 0;
  local_58 = 0;
  while( true ) {
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar1 = ebml_peek_id(this,levelUp);
    if (uVar1 == 0) {
      return -1;
    }
    if (*levelUp != 0) break;
    if (uVar1 == 0x9b) {
      iVar2 = ebml_read_uint(this,&local_34,&num);
      if (-1 < iVar2) {
        local_60 = num;
      }
    }
    else if (uVar1 == 0xfb) {
      sVar3 = std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>::size(&(this->packets).c);
      if (local_40 != sVar3) {
        ppAVar4 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppAVar4 ==
            (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          ppAVar4 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        ppAVar4[-1]->flags = 0;
      }
      iVar2 = ebml_read_sint(this,&local_34,&num);
      is_keyframe = 0;
    }
    else if (((uVar1 == 0xbf) || (uVar1 == 0xec)) || (uVar1 != 0xa1)) {
      iVar2 = ebml_read_skip(this);
    }
    else {
      local_58 = (this->super_IOContextDemuxer).m_processedBytes;
      iVar2 = ebml_read_binary(this,&local_34,&data,&size);
    }
    if (*levelUp != 0) {
      *levelUp = *levelUp + -1;
      if (iVar2 == 0) {
LAB_001ac2dc:
        if (data == (uint8_t *)0x0) {
          iVar2 = 0;
        }
        else {
          iVar2 = matroska_parse_block
                            (this,data,size,local_58,local_48,local_60,is_keyframe,
                             in_stack_ffffffffffffff80);
        }
      }
      return iVar2;
    }
  }
  *levelUp = *levelUp + -1;
  goto LAB_001ac2dc;
}

Assistant:

int MatroskaDemuxer::matroska_parse_blockgroup(const int64_t cluster_time)
{
    int res = 0;
    uint32_t id;
    int is_bframe = 0;
    int is_keyframe = PKT_FLAG_KEY;
    const size_t last_num_packets = packets.size();
    int64_t duration = AV_NOPTS_VALUE;
    uint8_t *data = nullptr;
    int size = 0;
    int64_t pos = 0;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* one block inside the group. Note, block parsing is one
         * of the harder things, so this code is a bit complicated.
         * See http://www.matroska.org/ for documentation. */
        case MATROSKA_ID_BLOCK:
        {
            pos = m_processedBytes;
            res = ebml_read_binary(&id, &data, &size);
            break;
        }

        case MATROSKA_ID_BLOCKDURATION:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            duration = num;
            break;
        }

        case MATROSKA_ID_BLOCKREFERENCE:
        {
            int64_t num;
            /* We've found a reference, so not even the first frame in
             * the lace is a key frame. */
            is_keyframe = 0;
            if (last_num_packets != packets.size())
                packets.back()->flags = 0;
            if ((res = ebml_read_sint(&id, &num)) < 0)
                break;
            if (num > 0)
                is_bframe = 1;
            break;
        }
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in blockgroup data");
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    if (res)
        return res;

    if (data != nullptr)
        res = matroska_parse_block(data, size, pos, cluster_time, duration, is_keyframe, is_bframe);

    return res;
}